

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O1

QString * __thiscall
ExportDirWrapper::getName(QString *__return_storage_ptr__,ExportDirWrapper *this)

{
  char16_t *pcVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QString t;
  QString libName;
  QArrayData *local_48 [3];
  QArrayData *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  QVar2.m_data = (storage_type *)0x6;
  QVar2.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = (Data *)local_30;
  local_30 = (QArrayData *)0x0;
  pcVar1 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).ptr = local_28;
  (__return_storage_ptr__->d).size = local_20;
  local_28 = pcVar1;
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])(&local_30,this)
  ;
  if (-1 < local_20) {
    QVar3.m_data = (storage_type *)0x2;
    QVar3.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar3);
    QString::append((QString *)local_48);
    QString::append((QString *)__return_storage_ptr__);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,8);
      }
    }
  }
  if (local_30 != (QArrayData *)0x0) {
    LOCK();
    (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString ExportDirWrapper::getName()
{
    QString infoName = "Export";
    QString libName = this->getLibraryName();
    if (libName.length() >= 0) {
        infoName += ": "+ libName;
    }
    return infoName;
}